

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.h
# Opt level: O0

bool __thiscall Js::DynamicObject::HasObjectArray(DynamicObject *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArrayObject **ppAVar4;
  byte local_19;
  DynamicObject *this_local;
  
  bVar2 = IsAnyArray(this);
  if (((!bVar2) && (bVar2 = UsesObjectArrayOrFlagsAsFlags(this), bVar2)) &&
     (bVar2 = IsObjectHeaderInlinedTypeHandler(this), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Types/DynamicObject.h"
                                ,0xd1,
                                "(DynamicObject::IsAnyArray((Var)this) || !UsesObjectArrayOrFlagsAsFlags() || IsObjectHeaderInlinedTypeHandler())"
                                ,
                                "DynamicObject::IsAnyArray((Var)this) || !UsesObjectArrayOrFlagsAsFlags() || IsObjectHeaderInlinedTypeHandler()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ppAVar4 = Memory::WriteBarrierPtr::operator_cast_to_ArrayObject__
                      ((WriteBarrierPtr *)&(this->field_1).objectArray);
  local_19 = 0;
  if (*ppAVar4 != (ArrayObject *)0x0) {
    bVar2 = UsesObjectArrayOrFlagsAsFlags(this);
    local_19 = 0;
    if (!bVar2) {
      bVar2 = IsObjectHeaderInlinedTypeHandler(this);
      local_19 = bVar2 ^ 0xff;
    }
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool HasObjectArray() const
        {
            // Only JavascriptArray uses the objectArrayOrFlags as flags.
            Assert(DynamicObject::IsAnyArray((Var)this) || !UsesObjectArrayOrFlagsAsFlags() || IsObjectHeaderInlinedTypeHandler());
            return ((objectArray != nullptr) && !UsesObjectArrayOrFlagsAsFlags() && !IsObjectHeaderInlinedTypeHandler());
        }